

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

int vm_new_fn(VM *vm,int pkg_idx)

{
  int iVar1;
  Function *pFVar2;
  Function *fn;
  int pkg_idx_local;
  VM *vm_local;
  
  if (vm->fns_capacity <= vm->fns_count) {
    vm->fns_capacity = vm->fns_capacity << 1;
    pFVar2 = (Function *)realloc(vm->fns,(long)vm->fns_capacity * 0x18);
    vm->fns = pFVar2;
  }
  iVar1 = vm->fns_count;
  vm->fns_count = iVar1 + 1;
  pFVar2 = vm->fns + iVar1;
  pFVar2->pkg = pkg_idx;
  pFVar2->ins = (BcIns *)0x0;
  pFVar2->ins_count = 0;
  pFVar2->ins_capacity = 0;
  return vm->fns_count + -1;
}

Assistant:

int vm_new_fn(VM *vm, int pkg_idx) {
	if (vm->fns_count >= vm->fns_capacity) {
		vm->fns_capacity *= 2;
		vm->fns = realloc(vm->fns, sizeof(Function) * vm->fns_capacity);
	}

	Function *fn = &vm->fns[vm->fns_count++];
	fn->pkg = pkg_idx;
	fn->ins = NULL; // Lazily instatiate the bytecode array
	fn->ins_count = 0;
	fn->ins_capacity = 0;
	return vm->fns_count - 1;
}